

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGraphGenerator.cpp
# Opt level: O1

bool __thiscall
ADS::RandomGraphGenerator::generate
          (RandomGraphGenerator *this,Graph<unsigned_int> *pGraph,uint uiNVerteces,uint uiDensity,
          bool bConnected,bool bPreGenerateVerticies)

{
  bool bVar1;
  bool bVar2;
  char *this_00;
  Graph<unsigned_int> *this_01;
  uint uiSrc;
  uint uVar3;
  double __x;
  
  if (pGraph == (Graph<unsigned_int> *)0x0) {
    bVar1 = false;
  }
  else {
    if (bPreGenerateVerticies && uiNVerteces != 0) {
      uVar3 = 0;
      do {
        Graph<unsigned_int>::addVertex(pGraph,uVar3);
        uVar3 = uVar3 + 1;
      } while (uiNVerteces != uVar3);
    }
    uVar3 = GraphUtils::getNumberOfEdges(uiNVerteces,uiDensity,pGraph->_bDirected);
    this_00 = "Creating graph of %u edges\n";
    log(__x);
    bVar1 = addEdges((RandomGraphGenerator *)this_00,pGraph,uiNVerteces,uVar3);
    if (bVar1 && bConnected) {
      do {
        this_01 = pGraph;
        bVar2 = Graph<unsigned_int>::isConnected(pGraph,false);
        if (bVar2) {
          return bVar1;
        }
        addEdges((RandomGraphGenerator *)this_01,pGraph,uiNVerteces,1);
      } while (bConnected);
    }
  }
  return bVar1;
}

Assistant:

bool RandomGraphGenerator::generate (Graph<unsigned int> *pGraph,
                                     unsigned int uiNVerteces,
                                     unsigned int uiDensity, bool bConnected,
                                     bool bPreGenerateVerticies)
{
    if (pGraph == NULL)
        return false;

    if (bPreGenerateVerticies)
        for (unsigned int uiSrc = 0; uiSrc < uiNVerteces; uiSrc++)
            pGraph->addVertex (uiSrc);

    unsigned int uiNEdges = GraphUtils::getNumberOfEdges (uiNVerteces, uiDensity,
                                                          pGraph->isDirected());
    log ("Creating graph of %u edges\n", uiNEdges);

    if (!addEdges (pGraph, uiNVerteces, uiNEdges))
        return false;

    while (bConnected && !pGraph->isConnected())
        /* add edges one-by-one until the graph is connected */
        addEdges (pGraph, uiNVerteces, 1);

    return true;
}